

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

exr_result_t exr_attr_string_init(exr_context_t ctxt,exr_attr_string_t *s,int32_t len)

{
  exr_result_t eVar1;
  char *pcVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar1 = 2;
  }
  else {
    if (len < 0) {
      eVar1 = (**(code **)(ctxt + 0x48))
                        (ctxt,3,"Received request to allocate negative sized string (%d)",len,
                         *(code **)(ctxt + 0x48));
      return eVar1;
    }
    if (s == (exr_attr_string_t *)0x0) {
      eVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid reference to string object to initialize");
      return eVar1;
    }
    s->length = 0;
    s->alloc_size = 0;
    s->str = (char *)0x0;
    pcVar2 = (char *)(**(code **)(ctxt + 0x58))(len + 1);
    s->str = pcVar2;
    if (pcVar2 == (char *)0x0) {
      eVar1 = (**(code **)(ctxt + 0x38))(ctxt,1);
      return eVar1;
    }
    s->length = len;
    s->alloc_size = len + 1;
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

exr_result_t
exr_attr_string_init (exr_context_t ctxt, exr_attr_string_t* s, int32_t len)
{
    exr_attr_string_t nil = {0};
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (len < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized string (%d)",
            len);

    if (!s)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to string object to initialize");

    *s     = nil;
    s->str = (char*) pctxt->alloc_fn ((size_t) (len + 1));
    if (s->str == NULL)
        return pctxt->standard_error (pctxt, EXR_ERR_OUT_OF_MEMORY);
    s->length     = len;
    s->alloc_size = len + 1;
    return EXR_ERR_SUCCESS;
}